

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

UChar * CReg::get(char *id)

{
  int iVar1;
  CReg *local_20;
  CReg *p;
  UChar *result;
  char *id_local;
  
  p = (CReg *)0x0;
  umtx_lock_63(&gCRegLock);
  local_20 = gCRegHead;
  ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
  do {
    if (local_20 == (CReg *)0x0) {
LAB_00372b14:
      umtx_unlock_63(&gCRegLock);
      return (UChar *)p;
    }
    iVar1 = strcmp(id,local_20->id);
    if (iVar1 == 0) {
      p = (CReg *)local_20->iso;
      goto LAB_00372b14;
    }
    local_20 = local_20->next;
  } while( true );
}

Assistant:

static const UChar* get(const char* id) {
        const UChar* result = NULL;
        umtx_lock(&gCRegLock);
        CReg* p = gCRegHead;

        /* register cleanup of the mutex */
        ucln_common_registerCleanup(UCLN_COMMON_CURRENCY, currency_cleanup);
        while (p) {
            if (uprv_strcmp(id, p->id) == 0) {
                result = p->iso;
                break;
            }
            p = p->next;
        }
        umtx_unlock(&gCRegLock);
        return result;
    }